

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord3f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord3f *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 local_55;
  float local_4d;
  optional<tinyusdz::value::texcoord3f> local_48;
  undefined8 local_35;
  float local_2d;
  double local_28;
  
  if (v == (texcoord3f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_value<tinyusdz::value::texcoord3f>(&local_48,this);
    if (local_48.has_value_ == true) {
      local_2d = (float)local_48.contained._8_4_;
      local_35 = local_48.contained._0_8_;
      local_55 = local_48.contained._0_8_;
      local_4d = (float)local_48.contained._8_4_;
    }
    if (local_48.has_value_ != false) goto LAB_001fd164;
    t = local_28;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord3f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::texcoord3f>(&local_48,this);
    if (local_48.has_value_ == true) {
      local_55 = local_48.contained._0_8_;
      local_4d = (float)local_48.contained._8_4_;
    }
    if (local_48.has_value_ != false) {
LAB_001fd164:
      v->r = local_4d;
      v->s = (float)(undefined4)local_55;
      v->t = (float)local_55._4_4_;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }